

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-merge.cpp
# Opt level: O0

void __thiscall
(anonymous_namespace)::updateNames(wasm::Module&,std::unordered_map<wasm::ModuleItemKind,std::
unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::
allocator<std::pair<wasm::Name_const,wasm::Name>>>,std::hash<wasm::ModuleItemKind>,std::
equal_to<wasm::ModuleItemKind>,std::allocator<std::pair<wasm::ModuleItemKind_const,std::
unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::
allocator<std::pair<wasm::Name_const,wasm::Name>>>>>>&)::NameMapper::visitExpression(wasm::
Expression__(void *this,Expression *curr)

{
  bool bVar1;
  Block *pBVar2;
  Switch *pSVar3;
  Call *pCVar4;
  CallIndirect *pCVar5;
  GlobalGet *pGVar6;
  GlobalSet *pGVar7;
  Load *pLVar8;
  Store *pSVar9;
  AtomicRMW *pAVar10;
  AtomicCmpxchg *pAVar11;
  AtomicWait *pAVar12;
  AtomicNotify *pAVar13;
  SIMDShuffle *pSVar14;
  size_type sVar15;
  SIMDLoad *pSVar16;
  SIMDLoadStoreLane *pSVar17;
  MemoryInit *pMVar18;
  DataDrop *pDVar19;
  MemoryCopy *pMVar20;
  MemoryFill *pMVar21;
  MemorySize *pMVar22;
  MemoryGrow *pMVar23;
  RefFunc *pRVar24;
  TableGet *pTVar25;
  TableSet *pTVar26;
  TableSize *pTVar27;
  TableGrow *pTVar28;
  TableFill *pTVar29;
  TableCopy *pTVar30;
  TableInit *pTVar31;
  Try *pTVar32;
  TryTable *pTVar33;
  Throw *pTVar34;
  TupleMake *pTVar35;
  CallRef *pCVar36;
  StructNew *pSVar37;
  ArrayNewData *pAVar38;
  ArrayNewElem *pAVar39;
  ArrayNewFixed *pAVar40;
  ArrayInitData *pAVar41;
  ArrayInitElem *pAVar42;
  ContBind *pCVar43;
  Suspend *pSVar44;
  Resume *pRVar45;
  ResumeThrow *pRVar46;
  IString *pIVar47;
  Name *pNVar48;
  StackSwitch *pSVar49;
  size_t sVar50;
  int local_3ac;
  int i_26;
  StackSwitch *cast_94;
  Index i_25;
  Index i_24;
  int i_23;
  Index i_22;
  ResumeThrow *cast_93;
  Index i_21;
  Index i_20;
  int i_19;
  Index i_18;
  Resume *cast_92;
  int i_17;
  Suspend *cast_91;
  int i_16;
  ContBind *cast_90;
  ContNew *cast_89;
  StringSliceWTF *cast_88;
  StringWTF16Get *cast_87;
  StringEq *cast_86;
  StringConcat *cast_85;
  StringEncode *cast_84;
  StringMeasure *cast_83;
  StringConst *cast_82;
  StringNew *cast_81;
  RefAs *cast_80;
  ArrayInitElem *cast_79;
  ArrayInitData *cast_78;
  ArrayFill *cast_77;
  ArrayCopy *cast_76;
  ArrayLen *cast_75;
  ArraySet *cast_74;
  ArrayGet *cast_73;
  int i_15;
  ArrayNewFixed *cast_72;
  ArrayNewElem *cast_71;
  ArrayNewData *cast_70;
  ArrayNew *cast_69;
  StructCmpxchg *cast_68;
  StructRMW *cast_67;
  StructSet *cast_66;
  StructGet *cast_65;
  int i_14;
  StructNew *cast_64;
  BrOn *cast_63;
  RefCast *cast_62;
  RefTest *cast_61;
  int i_13;
  CallRef *cast_60;
  I31Get *cast_59;
  RefI31 *cast_58;
  TupleExtract *cast_57;
  int i_12;
  TupleMake *cast_56;
  Pop *cast_55;
  Unreachable *cast_54;
  Nop *cast_53;
  ThrowRef *cast_52;
  Rethrow *cast_51;
  int i_11;
  Throw *cast_50;
  Index i_10;
  Index i_9;
  Index i_8;
  Index i_7;
  TryTable *cast_49;
  Index i_6;
  int i_5;
  Try *cast_48;
  TableInit *cast_47;
  TableCopy *cast_46;
  TableFill *cast_45;
  TableGrow *cast_44;
  TableSize *cast_43;
  TableSet *cast_42;
  TableGet *cast_41;
  RefEq *cast_40;
  RefFunc *cast_39;
  RefIsNull *cast_38;
  RefNull *cast_37;
  MemoryGrow *cast_36;
  MemorySize *cast_35;
  Return *cast_34;
  Drop *cast_33;
  Select *cast_32;
  Binary *cast_31;
  Unary *cast_30;
  Const *cast_29;
  MemoryFill *cast_28;
  MemoryCopy *cast_27;
  DataDrop *cast_26;
  MemoryInit *cast_25;
  SIMDLoadStoreLane *cast_24;
  SIMDLoad *cast_23;
  SIMDShift *cast_22;
  SIMDTernary *cast_21;
  Index i_4;
  SIMDShuffle *cast_20;
  SIMDReplace *cast_19;
  SIMDExtract *cast_18;
  AtomicFence *cast_17;
  AtomicNotify *cast_16;
  AtomicWait *cast_15;
  AtomicCmpxchg *cast_14;
  AtomicRMW *cast_13;
  Store *cast_12;
  Load *cast_11;
  GlobalSet *cast_10;
  GlobalGet *cast_9;
  LocalSet *cast_8;
  LocalGet *cast_7;
  int i_3;
  CallIndirect *cast_6;
  int i_2;
  Call *cast_5;
  Index i_1;
  Switch *cast_4;
  Break *cast_3;
  Loop *cast_2;
  If *cast_1;
  int i;
  Block *cast;
  Expression *curr_local;
  NameMapper *this_local;
  
  switch(curr->_id) {
  case InvalidId:
  case NumExpressionIds:
    wasm::handle_unreachable
              ("unexpected expression type",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-delegations-fields.def"
               ,0x103);
  case BlockId:
    pBVar2 = wasm::Expression::cast<wasm::Block>(curr);
    sVar50 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       (&(pBVar2->list).
                         super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>)
    ;
    cast_1._4_4_ = (int)sVar50;
    do {
      cast_1._4_4_ = cast_1._4_4_ + -1;
    } while (-1 < cast_1._4_4_);
    break;
  case IfId:
    wasm::Expression::cast<wasm::If>(curr);
    break;
  case LoopId:
    wasm::Expression::cast<wasm::Loop>(curr);
    break;
  case BreakId:
    wasm::Expression::cast<wasm::Break>(curr);
    break;
  case SwitchId:
    pSVar3 = wasm::Expression::cast<wasm::Switch>(curr);
    for (cast_5._4_4_ = 0;
        sVar50 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                           ((ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)(pSVar3 + 0x10))
        , cast_5._4_4_ < sVar50; cast_5._4_4_ = cast_5._4_4_ + 1) {
    }
    break;
  case CallId:
    pCVar4 = wasm::Expression::cast<wasm::Call>(curr);
    sVar50 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       (&(pCVar4->operands).
                         super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>)
    ;
    cast_6._4_4_ = (int)sVar50;
    do {
      cast_6._4_4_ = cast_6._4_4_ + -1;
    } while (-1 < cast_6._4_4_);
    bVar1 = wasm::IString::is(&(pCVar4->target).super_IString);
    if (bVar1) {
      mapName(wasm::ModuleItemKind,wasm::Name__(this,Function,&pCVar4->target);
    }
    break;
  case CallIndirectId:
    pCVar5 = wasm::Expression::cast<wasm::CallIndirect>(curr);
    bVar1 = wasm::IString::is((IString *)(pCVar5 + 0x40));
    if (bVar1) {
      mapName(wasm::ModuleItemKind,wasm::Name__(this,Table,(Name *)(pCVar5 + 0x40));
    }
    sVar50 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                        (pCVar5 + 0x18));
    cast_7._4_4_ = (int)sVar50;
    do {
      cast_7._4_4_ = cast_7._4_4_ + -1;
    } while (-1 < cast_7._4_4_);
    break;
  case LocalGetId:
    wasm::Expression::cast<wasm::LocalGet>(curr);
    break;
  case LocalSetId:
    wasm::Expression::cast<wasm::LocalSet>(curr);
    break;
  case GlobalGetId:
    pGVar6 = wasm::Expression::cast<wasm::GlobalGet>(curr);
    bVar1 = wasm::IString::is((IString *)(pGVar6 + 0x10));
    if (bVar1) {
      mapName(wasm::ModuleItemKind,wasm::Name__(this,Global,(Name *)(pGVar6 + 0x10));
    }
    break;
  case GlobalSetId:
    pGVar7 = wasm::Expression::cast<wasm::GlobalSet>(curr);
    bVar1 = wasm::IString::is((IString *)(pGVar7 + 0x10));
    if (bVar1) {
      mapName(wasm::ModuleItemKind,wasm::Name__(this,Global,(Name *)(pGVar7 + 0x10));
    }
    break;
  case LoadId:
    pLVar8 = wasm::Expression::cast<wasm::Load>(curr);
    bVar1 = wasm::IString::is((IString *)(pLVar8 + 0x38));
    if (bVar1) {
      mapName(wasm::ModuleItemKind,wasm::Name__(this,Memory,(Name *)(pLVar8 + 0x38));
    }
    break;
  case StoreId:
    pSVar9 = wasm::Expression::cast<wasm::Store>(curr);
    bVar1 = wasm::IString::is((IString *)(pSVar9 + 0x48));
    if (bVar1) {
      mapName(wasm::ModuleItemKind,wasm::Name__(this,Memory,(Name *)(pSVar9 + 0x48));
    }
    break;
  case ConstId:
    wasm::Expression::cast<wasm::Const>(curr);
    break;
  case UnaryId:
    wasm::Expression::cast<wasm::Unary>(curr);
    break;
  case BinaryId:
    wasm::Expression::cast<wasm::Binary>(curr);
    break;
  case SelectId:
    wasm::Expression::cast<wasm::Select>(curr);
    break;
  case DropId:
    wasm::Expression::cast<wasm::Drop>(curr);
    break;
  case ReturnId:
    wasm::Expression::cast<wasm::Return>(curr);
    break;
  case MemorySizeId:
    pMVar22 = wasm::Expression::cast<wasm::MemorySize>(curr);
    bVar1 = wasm::IString::is((IString *)(pMVar22 + 0x10));
    if (bVar1) {
      mapName(wasm::ModuleItemKind,wasm::Name__(this,Memory,(Name *)(pMVar22 + 0x10));
    }
    break;
  case MemoryGrowId:
    pMVar23 = wasm::Expression::cast<wasm::MemoryGrow>(curr);
    bVar1 = wasm::IString::is((IString *)(pMVar23 + 0x18));
    if (bVar1) {
      mapName(wasm::ModuleItemKind,wasm::Name__(this,Memory,(Name *)(pMVar23 + 0x18));
    }
    break;
  case NopId:
    wasm::Expression::cast<wasm::Nop>(curr);
    break;
  case UnreachableId:
    wasm::Expression::cast<wasm::Unreachable>(curr);
    break;
  case AtomicRMWId:
    pAVar10 = wasm::Expression::cast<wasm::AtomicRMW>(curr);
    bVar1 = wasm::IString::is((IString *)(pAVar10 + 0x30));
    if (bVar1) {
      mapName(wasm::ModuleItemKind,wasm::Name__(this,Memory,(Name *)(pAVar10 + 0x30));
    }
    break;
  case AtomicCmpxchgId:
    pAVar11 = wasm::Expression::cast<wasm::AtomicCmpxchg>(curr);
    bVar1 = wasm::IString::is((IString *)(pAVar11 + 0x38));
    if (bVar1) {
      mapName(wasm::ModuleItemKind,wasm::Name__(this,Memory,(Name *)(pAVar11 + 0x38));
    }
    break;
  case AtomicWaitId:
    pAVar12 = wasm::Expression::cast<wasm::AtomicWait>(curr);
    bVar1 = wasm::IString::is((IString *)(pAVar12 + 0x38));
    if (bVar1) {
      mapName(wasm::ModuleItemKind,wasm::Name__(this,Memory,(Name *)(pAVar12 + 0x38));
    }
    break;
  case AtomicNotifyId:
    pAVar13 = wasm::Expression::cast<wasm::AtomicNotify>(curr);
    bVar1 = wasm::IString::is((IString *)(pAVar13 + 0x28));
    if (bVar1) {
      mapName(wasm::ModuleItemKind,wasm::Name__(this,Memory,(Name *)(pAVar13 + 0x28));
    }
    break;
  case AtomicFenceId:
    wasm::Expression::cast<wasm::AtomicFence>(curr);
    break;
  case SIMDExtractId:
    wasm::Expression::cast<wasm::SIMDExtract>(curr);
    break;
  case SIMDReplaceId:
    wasm::Expression::cast<wasm::SIMDReplace>(curr);
    break;
  case SIMDShuffleId:
    pSVar14 = wasm::Expression::cast<wasm::SIMDShuffle>(curr);
    for (cast_21._4_4_ = 0;
        sVar15 = std::array<unsigned_char,_16UL>::size
                           ((array<unsigned_char,_16UL> *)(pSVar14 + 0x20)), cast_21._4_4_ < sVar15;
        cast_21._4_4_ = cast_21._4_4_ + 1) {
    }
    break;
  case SIMDTernaryId:
    wasm::Expression::cast<wasm::SIMDTernary>(curr);
    break;
  case SIMDShiftId:
    wasm::Expression::cast<wasm::SIMDShift>(curr);
    break;
  case SIMDLoadId:
    pSVar16 = wasm::Expression::cast<wasm::SIMDLoad>(curr);
    bVar1 = wasm::IString::is((IString *)(pSVar16 + 0x30));
    if (bVar1) {
      mapName(wasm::ModuleItemKind,wasm::Name__(this,Memory,(Name *)(pSVar16 + 0x30));
    }
    break;
  case SIMDLoadStoreLaneId:
    pSVar17 = wasm::Expression::cast<wasm::SIMDLoadStoreLane>(curr);
    bVar1 = wasm::IString::is((IString *)(pSVar17 + 0x40));
    if (bVar1) {
      mapName(wasm::ModuleItemKind,wasm::Name__(this,Memory,(Name *)(pSVar17 + 0x40));
    }
    break;
  case MemoryInitId:
    pMVar18 = wasm::Expression::cast<wasm::MemoryInit>(curr);
    bVar1 = wasm::IString::is((IString *)(pMVar18 + 0x10));
    if (bVar1) {
      mapName(wasm::ModuleItemKind,wasm::Name__(this,DataSegment,(Name *)(pMVar18 + 0x10));
    }
    bVar1 = wasm::IString::is((IString *)(pMVar18 + 0x38));
    if (bVar1) {
      mapName(wasm::ModuleItemKind,wasm::Name__(this,Memory,(Name *)(pMVar18 + 0x38));
    }
    break;
  case DataDropId:
    pDVar19 = wasm::Expression::cast<wasm::DataDrop>(curr);
    bVar1 = wasm::IString::is((IString *)(pDVar19 + 0x10));
    if (bVar1) {
      mapName(wasm::ModuleItemKind,wasm::Name__(this,DataSegment,(Name *)(pDVar19 + 0x10));
    }
    break;
  case MemoryCopyId:
    pMVar20 = wasm::Expression::cast<wasm::MemoryCopy>(curr);
    bVar1 = wasm::IString::is((IString *)(pMVar20 + 0x38));
    if (bVar1) {
      mapName(wasm::ModuleItemKind,wasm::Name__(this,Memory,(Name *)(pMVar20 + 0x38));
    }
    bVar1 = wasm::IString::is((IString *)(pMVar20 + 0x28));
    if (bVar1) {
      mapName(wasm::ModuleItemKind,wasm::Name__(this,Memory,(Name *)(pMVar20 + 0x28));
    }
    break;
  case MemoryFillId:
    pMVar21 = wasm::Expression::cast<wasm::MemoryFill>(curr);
    bVar1 = wasm::IString::is((IString *)(pMVar21 + 0x28));
    if (bVar1) {
      mapName(wasm::ModuleItemKind,wasm::Name__(this,Memory,(Name *)(pMVar21 + 0x28));
    }
    break;
  case PopId:
    wasm::Expression::cast<wasm::Pop>(curr);
    break;
  case RefNullId:
    wasm::Expression::cast<wasm::RefNull>(curr);
    break;
  case RefIsNullId:
    wasm::Expression::cast<wasm::RefIsNull>(curr);
    break;
  case RefFuncId:
    pRVar24 = wasm::Expression::cast<wasm::RefFunc>(curr);
    bVar1 = wasm::IString::is((IString *)(pRVar24 + 0x10));
    if (bVar1) {
      mapName(wasm::ModuleItemKind,wasm::Name__(this,Function,(Name *)(pRVar24 + 0x10));
    }
    break;
  case RefEqId:
    wasm::Expression::cast<wasm::RefEq>(curr);
    break;
  case TableGetId:
    pTVar25 = wasm::Expression::cast<wasm::TableGet>(curr);
    bVar1 = wasm::IString::is((IString *)(pTVar25 + 0x10));
    if (bVar1) {
      mapName(wasm::ModuleItemKind,wasm::Name__(this,Table,(Name *)(pTVar25 + 0x10));
    }
    break;
  case TableSetId:
    pTVar26 = wasm::Expression::cast<wasm::TableSet>(curr);
    bVar1 = wasm::IString::is((IString *)(pTVar26 + 0x10));
    if (bVar1) {
      mapName(wasm::ModuleItemKind,wasm::Name__(this,Table,(Name *)(pTVar26 + 0x10));
    }
    break;
  case TableSizeId:
    pTVar27 = wasm::Expression::cast<wasm::TableSize>(curr);
    bVar1 = wasm::IString::is((IString *)(pTVar27 + 0x10));
    if (bVar1) {
      mapName(wasm::ModuleItemKind,wasm::Name__(this,Table,(Name *)(pTVar27 + 0x10));
    }
    break;
  case TableGrowId:
    pTVar28 = wasm::Expression::cast<wasm::TableGrow>(curr);
    bVar1 = wasm::IString::is((IString *)(pTVar28 + 0x10));
    if (bVar1) {
      mapName(wasm::ModuleItemKind,wasm::Name__(this,Table,(Name *)(pTVar28 + 0x10));
    }
    break;
  case TableFillId:
    pTVar29 = wasm::Expression::cast<wasm::TableFill>(curr);
    bVar1 = wasm::IString::is((IString *)(pTVar29 + 0x10));
    if (bVar1) {
      mapName(wasm::ModuleItemKind,wasm::Name__(this,Table,(Name *)(pTVar29 + 0x10));
    }
    break;
  case TableCopyId:
    pTVar30 = wasm::Expression::cast<wasm::TableCopy>(curr);
    bVar1 = wasm::IString::is((IString *)(pTVar30 + 0x38));
    if (bVar1) {
      mapName(wasm::ModuleItemKind,wasm::Name__(this,Table,(Name *)(pTVar30 + 0x38));
    }
    bVar1 = wasm::IString::is((IString *)(pTVar30 + 0x28));
    if (bVar1) {
      mapName(wasm::ModuleItemKind,wasm::Name__(this,Table,(Name *)(pTVar30 + 0x28));
    }
    break;
  case TableInitId:
    pTVar31 = wasm::Expression::cast<wasm::TableInit>(curr);
    bVar1 = wasm::IString::is((IString *)(pTVar31 + 0x10));
    if (bVar1) {
      mapName(wasm::ModuleItemKind,wasm::Name__(this,ElementSegment,(Name *)(pTVar31 + 0x10));
    }
    bVar1 = wasm::IString::is((IString *)(pTVar31 + 0x38));
    if (bVar1) {
      mapName(wasm::ModuleItemKind,wasm::Name__(this,Table,(Name *)(pTVar31 + 0x38));
    }
    break;
  case TryId:
    pTVar32 = wasm::Expression::cast<wasm::Try>(curr);
    sVar50 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                        (pTVar32 + 0x48));
    cast_49._4_4_ = (int)sVar50;
    do {
      cast_49._4_4_ = cast_49._4_4_ + -1;
    } while (-1 < cast_49._4_4_);
    for (cast_49._0_4_ = 0;
        sVar50 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                           ((ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)(pTVar32 + 0x28)
                           ), (uint)cast_49 < sVar50; cast_49._0_4_ = (uint)cast_49 + 1) {
      pIVar47 = &ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                           ((ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)(pTVar32 + 0x28)
                            ,(ulong)(uint)cast_49)->super_IString;
      bVar1 = wasm::IString::is(pIVar47);
      if (bVar1) {
        pNVar48 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                            ((ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)
                             (pTVar32 + 0x28),(ulong)(uint)cast_49);
        mapName(wasm::ModuleItemKind,wasm::Name__(this,Tag,pNVar48);
      }
    }
    break;
  case TryTableId:
    pTVar33 = wasm::Expression::cast<wasm::TryTable>(curr);
    for (i_9 = 0; sVar50 = ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>::size
                                     ((ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type> *)
                                      (pTVar33 + 0x78)), i_9 < sVar50; i_9 = i_9 + 1) {
    }
    for (i_10 = 0;
        sVar50 = ArenaVectorBase<ArenaVector<bool>,_bool>::size
                           ((ArenaVectorBase<ArenaVector<bool>,_bool> *)(pTVar33 + 0x58)),
        i_10 < sVar50; i_10 = i_10 + 1) {
    }
    for (cast_50._4_4_ = 0;
        sVar50 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                           ((ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)(pTVar33 + 0x38)
                           ), cast_50._4_4_ < sVar50; cast_50._4_4_ = cast_50._4_4_ + 1) {
    }
    for (cast_50._0_4_ = 0;
        sVar50 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                           ((ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)(pTVar33 + 0x18)
                           ), (uint)cast_50 < sVar50; cast_50._0_4_ = (uint)cast_50 + 1) {
      pIVar47 = &ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                           ((ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)(pTVar33 + 0x18)
                            ,(ulong)(uint)cast_50)->super_IString;
      bVar1 = wasm::IString::is(pIVar47);
      if (bVar1) {
        pNVar48 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                            ((ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)
                             (pTVar33 + 0x18),(ulong)(uint)cast_50);
        mapName(wasm::ModuleItemKind,wasm::Name__(this,Tag,pNVar48);
      }
    }
    break;
  case ThrowId:
    pTVar34 = wasm::Expression::cast<wasm::Throw>(curr);
    sVar50 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                        (pTVar34 + 0x20));
    cast_51._4_4_ = (int)sVar50;
    do {
      cast_51._4_4_ = cast_51._4_4_ + -1;
    } while (-1 < cast_51._4_4_);
    bVar1 = wasm::IString::is((IString *)(pTVar34 + 0x10));
    if (bVar1) {
      mapName(wasm::ModuleItemKind,wasm::Name__(this,Tag,(Name *)(pTVar34 + 0x10));
    }
    break;
  case RethrowId:
    wasm::Expression::cast<wasm::Rethrow>(curr);
    break;
  case ThrowRefId:
    wasm::Expression::cast<wasm::ThrowRef>(curr);
    break;
  case TupleMakeId:
    pTVar35 = wasm::Expression::cast<wasm::TupleMake>(curr);
    sVar50 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                        (pTVar35 + 0x10));
    cast_57._4_4_ = (int)sVar50;
    do {
      cast_57._4_4_ = cast_57._4_4_ + -1;
    } while (-1 < cast_57._4_4_);
    break;
  case TupleExtractId:
    wasm::Expression::cast<wasm::TupleExtract>(curr);
    break;
  case RefI31Id:
    wasm::Expression::cast<wasm::RefI31>(curr);
    break;
  case I31GetId:
    wasm::Expression::cast<wasm::I31Get>(curr);
    break;
  case CallRefId:
    pCVar36 = wasm::Expression::cast<wasm::CallRef>(curr);
    sVar50 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                        (pCVar36 + 0x10));
    cast_61._4_4_ = (int)sVar50;
    do {
      cast_61._4_4_ = cast_61._4_4_ + -1;
    } while (-1 < cast_61._4_4_);
    break;
  case RefTestId:
    wasm::Expression::cast<wasm::RefTest>(curr);
    break;
  case RefCastId:
    wasm::Expression::cast<wasm::RefCast>(curr);
    break;
  case BrOnId:
    wasm::Expression::cast<wasm::BrOn>(curr);
    break;
  case StructNewId:
    pSVar37 = wasm::Expression::cast<wasm::StructNew>(curr);
    sVar50 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                        (pSVar37 + 0x10));
    cast_65._4_4_ = (int)sVar50;
    do {
      cast_65._4_4_ = cast_65._4_4_ + -1;
    } while (-1 < cast_65._4_4_);
    break;
  case StructGetId:
    wasm::Expression::cast<wasm::StructGet>(curr);
    break;
  case StructSetId:
    wasm::Expression::cast<wasm::StructSet>(curr);
    break;
  case StructRMWId:
    wasm::Expression::cast<wasm::StructRMW>(curr);
    break;
  case StructCmpxchgId:
    wasm::Expression::cast<wasm::StructCmpxchg>(curr);
    break;
  case ArrayNewId:
    wasm::Expression::cast<wasm::ArrayNew>(curr);
    break;
  case ArrayNewDataId:
    pAVar38 = wasm::Expression::cast<wasm::ArrayNewData>(curr);
    bVar1 = wasm::IString::is((IString *)(pAVar38 + 0x10));
    if (bVar1) {
      mapName(wasm::ModuleItemKind,wasm::Name__(this,DataSegment,(Name *)(pAVar38 + 0x10));
    }
    break;
  case ArrayNewElemId:
    pAVar39 = wasm::Expression::cast<wasm::ArrayNewElem>(curr);
    bVar1 = wasm::IString::is((IString *)(pAVar39 + 0x10));
    if (bVar1) {
      mapName(wasm::ModuleItemKind,wasm::Name__(this,ElementSegment,(Name *)(pAVar39 + 0x10));
    }
    break;
  case ArrayNewFixedId:
    pAVar40 = wasm::Expression::cast<wasm::ArrayNewFixed>(curr);
    sVar50 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                        (pAVar40 + 0x10));
    cast_73._4_4_ = (int)sVar50;
    do {
      cast_73._4_4_ = cast_73._4_4_ + -1;
    } while (-1 < cast_73._4_4_);
    break;
  case ArrayGetId:
    wasm::Expression::cast<wasm::ArrayGet>(curr);
    break;
  case ArraySetId:
    wasm::Expression::cast<wasm::ArraySet>(curr);
    break;
  case ArrayLenId:
    wasm::Expression::cast<wasm::ArrayLen>(curr);
    break;
  case ArrayCopyId:
    wasm::Expression::cast<wasm::ArrayCopy>(curr);
    break;
  case ArrayFillId:
    wasm::Expression::cast<wasm::ArrayFill>(curr);
    break;
  case ArrayInitDataId:
    pAVar41 = wasm::Expression::cast<wasm::ArrayInitData>(curr);
    bVar1 = wasm::IString::is((IString *)(pAVar41 + 0x10));
    if (bVar1) {
      mapName(wasm::ModuleItemKind,wasm::Name__(this,DataSegment,(Name *)(pAVar41 + 0x10));
    }
    break;
  case ArrayInitElemId:
    pAVar42 = wasm::Expression::cast<wasm::ArrayInitElem>(curr);
    bVar1 = wasm::IString::is((IString *)(pAVar42 + 0x10));
    if (bVar1) {
      mapName(wasm::ModuleItemKind,wasm::Name__(this,ElementSegment,(Name *)(pAVar42 + 0x10));
    }
    break;
  case RefAsId:
    wasm::Expression::cast<wasm::RefAs>(curr);
    break;
  case StringNewId:
    wasm::Expression::cast<wasm::StringNew>(curr);
    break;
  case StringConstId:
    wasm::Expression::cast<wasm::StringConst>(curr);
    break;
  case StringMeasureId:
    wasm::Expression::cast<wasm::StringMeasure>(curr);
    break;
  case StringEncodeId:
    wasm::Expression::cast<wasm::StringEncode>(curr);
    break;
  case StringConcatId:
    wasm::Expression::cast<wasm::StringConcat>(curr);
    break;
  case StringEqId:
    wasm::Expression::cast<wasm::StringEq>(curr);
    break;
  case StringWTF16GetId:
    wasm::Expression::cast<wasm::StringWTF16Get>(curr);
    break;
  case StringSliceWTFId:
    wasm::Expression::cast<wasm::StringSliceWTF>(curr);
    break;
  case ContNewId:
    wasm::Expression::cast<wasm::ContNew>(curr);
    break;
  case ContBindId:
    pCVar43 = wasm::Expression::cast<wasm::ContBind>(curr);
    sVar50 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                        (pCVar43 + 0x10));
    cast_91._4_4_ = (int)sVar50;
    do {
      cast_91._4_4_ = cast_91._4_4_ + -1;
    } while (-1 < cast_91._4_4_);
    break;
  case SuspendId:
    pSVar44 = wasm::Expression::cast<wasm::Suspend>(curr);
    sVar50 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                        (pSVar44 + 0x20));
    cast_92._4_4_ = (int)sVar50;
    do {
      cast_92._4_4_ = cast_92._4_4_ + -1;
    } while (-1 < cast_92._4_4_);
    bVar1 = wasm::IString::is((IString *)(pSVar44 + 0x10));
    if (bVar1) {
      mapName(wasm::ModuleItemKind,wasm::Name__(this,Tag,(Name *)(pSVar44 + 0x10));
    }
    break;
  case ResumeId:
    pRVar45 = wasm::Expression::cast<wasm::Resume>(curr);
    for (i_20 = 0;
        sVar50 = ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>::size
                           ((ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type> *)(pRVar45 + 0x78)
                           ), i_20 < sVar50; i_20 = i_20 + 1) {
    }
    sVar50 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                        (pRVar45 + 0x50));
    i_21 = (Index)sVar50;
    do {
      i_21 = i_21 - 1;
    } while (-1 < (int)i_21);
    for (cast_93._4_4_ = 0;
        sVar50 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                           ((ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)(pRVar45 + 0x30)
                           ), cast_93._4_4_ < sVar50; cast_93._4_4_ = cast_93._4_4_ + 1) {
    }
    for (cast_93._0_4_ = 0;
        sVar50 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                           ((ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)(pRVar45 + 0x10)
                           ), (uint)cast_93 < sVar50; cast_93._0_4_ = (uint)cast_93 + 1) {
      pIVar47 = &ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                           ((ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)(pRVar45 + 0x10)
                            ,(ulong)(uint)cast_93)->super_IString;
      bVar1 = wasm::IString::is(pIVar47);
      if (bVar1) {
        pNVar48 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                            ((ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)
                             (pRVar45 + 0x10),(ulong)(uint)cast_93);
        mapName(wasm::ModuleItemKind,wasm::Name__(this,Tag,pNVar48);
      }
    }
    break;
  case ResumeThrowId:
    pRVar46 = wasm::Expression::cast<wasm::ResumeThrow>(curr);
    for (i_24 = 0;
        sVar50 = ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>::size
                           ((ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type> *)(pRVar46 + 0x88)
                           ), i_24 < sVar50; i_24 = i_24 + 1) {
    }
    sVar50 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                        (pRVar46 + 0x60));
    i_25 = (Index)sVar50;
    do {
      i_25 = i_25 - 1;
    } while (-1 < (int)i_25);
    for (cast_94._4_4_ = 0;
        sVar50 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                           ((ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)(pRVar46 + 0x40)
                           ), cast_94._4_4_ < sVar50; cast_94._4_4_ = cast_94._4_4_ + 1) {
    }
    for (cast_94._0_4_ = 0;
        sVar50 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                           ((ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)(pRVar46 + 0x20)
                           ), (uint)cast_94 < sVar50; cast_94._0_4_ = (uint)cast_94 + 1) {
      pIVar47 = &ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                           ((ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)(pRVar46 + 0x20)
                            ,(ulong)(uint)cast_94)->super_IString;
      bVar1 = wasm::IString::is(pIVar47);
      if (bVar1) {
        pNVar48 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                            ((ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)
                             (pRVar46 + 0x20),(ulong)(uint)cast_94);
        mapName(wasm::ModuleItemKind,wasm::Name__(this,Tag,pNVar48);
      }
    }
    bVar1 = wasm::IString::is((IString *)(pRVar46 + 0x10));
    if (bVar1) {
      mapName(wasm::ModuleItemKind,wasm::Name__(this,Tag,(Name *)(pRVar46 + 0x10));
    }
    break;
  case StackSwitchId:
    pSVar49 = wasm::Expression::cast<wasm::StackSwitch>(curr);
    sVar50 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                        (pSVar49 + 0x20));
    local_3ac = (int)sVar50;
    do {
      local_3ac = local_3ac + -1;
    } while (-1 < local_3ac);
    bVar1 = wasm::IString::is((IString *)(pSVar49 + 0x10));
    if (bVar1) {
      mapName(wasm::ModuleItemKind,wasm::Name__(this,Tag,(Name *)(pSVar49 + 0x10));
    }
  }
  return;
}

Assistant:

void visitExpression(Expression* curr) {
#define DELEGATE_ID curr->_id

#define DELEGATE_START(id) [[maybe_unused]] auto* cast = curr->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_TYPE(id, field)
#define DELEGATE_FIELD_HEAPTYPE(id, field)
#define DELEGATE_FIELD_CHILD(id, field)
#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)
#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#define DELEGATE_FIELD_NAME_KIND(id, field, kind)                              \
  if (cast->field.is()) {                                                      \
    mapName(kind, cast->field);                                                \
  }

#include "wasm-delegations-fields.def"
    }